

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::CodedInputStream::SkipFallback
          (CodedInputStream *this,int count,int original_buffer_size)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  if (this->buffer_size_after_limit_ < 1) {
    uVar2 = count - original_buffer_size;
    this->buffer_ = (uint8_t *)0x0;
    this->buffer_end_ = (uint8_t *)0x0;
    iVar1 = this->current_limit_;
    if (this->total_bytes_limit_ < this->current_limit_) {
      iVar1 = this->total_bytes_limit_;
    }
    iVar3 = iVar1 - this->total_bytes_read_;
    if (iVar3 < (int)uVar2) {
      if (0 < iVar3) {
        this->total_bytes_read_ = iVar1;
        (*this->input_->_vptr_ZeroCopyInputStream[4])();
      }
    }
    else {
      iVar1 = (*this->input_->_vptr_ZeroCopyInputStream[4])(this->input_,(ulong)uVar2);
      if ((char)iVar1 != '\0') {
        this->total_bytes_read_ = this->total_bytes_read_ + uVar2;
        return true;
      }
      iVar1 = (*this->input_->_vptr_ZeroCopyInputStream[5])();
      this->total_bytes_read_ = iVar1;
    }
  }
  else {
    this->buffer_ = this->buffer_ + original_buffer_size;
  }
  return false;
}

Assistant:

bool CodedInputStream::SkipFallback(int count, int original_buffer_size) {
  if (buffer_size_after_limit_ > 0) {
    // We hit a limit inside this buffer.  Advance to the limit and fail.
    Advance(original_buffer_size);
    return false;
  }

  count -= original_buffer_size;
  buffer_ = NULL;
  buffer_end_ = buffer_;

  // Make sure this skip doesn't try to skip past the current limit.
  int closest_limit = std::min(current_limit_, total_bytes_limit_);
  int bytes_until_limit = closest_limit - total_bytes_read_;
  if (bytes_until_limit < count) {
    // We hit the limit.  Skip up to it then fail.
    if (bytes_until_limit > 0) {
      total_bytes_read_ = closest_limit;
      input_->Skip(bytes_until_limit);
    }
    return false;
  }

  if (!input_->Skip(count)) {
    total_bytes_read_ = input_->ByteCount();
    return false;
  }
  total_bytes_read_ += count;
  return true;
}